

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *file_00;
  byte local_35;
  int local_34;
  undefined1 local_30 [4];
  int i;
  bool local_20;
  FileDescriptor *local_18;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  local_35 = 1;
  local_18 = file;
  file_local = (FileDescriptor *)this;
  if (file != (FileDescriptor *)0x0) {
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::insert<const_google::protobuf::FileDescriptor_*,_0,_0>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                *)local_30,
               &(this->dependencies_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ,&local_18);
    local_35 = local_20 ^ 0xff;
  }
  if ((local_35 & 1) == 0) {
    local_34 = 0;
    while( true ) {
      bVar1 = false;
      if (local_18 != (FileDescriptor *)0x0) {
        iVar2 = FileDescriptor::public_dependency_count(local_18);
        bVar1 = local_34 < iVar2;
      }
      if (!bVar1) break;
      file_00 = FileDescriptor::public_dependency(local_18,local_34);
      RecordPublicDependencies(this,file_00);
      local_34 = local_34 + 1;
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == nullptr || !dependencies_.insert(file).second) return;
  for (int i = 0; file != nullptr && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}